

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# x509_vfy.cc
# Opt level: O0

int crl_akid_check(X509_STORE_CTX *ctx,X509_CRL *crl,X509 **pissuer,int *pcrl_score)

{
  int iVar1;
  X509_NAME *b;
  size_t sVar2;
  X509 *pXVar3;
  X509_NAME *a;
  int local_44;
  int cidx;
  X509_NAME *cnm;
  X509 *crl_issuer;
  int *pcrl_score_local;
  X509 **pissuer_local;
  X509_CRL *crl_local;
  X509_STORE_CTX *ctx_local;
  
  b = X509_CRL_get_issuer(crl);
  local_44 = ctx->error_depth;
  sVar2 = sk_X509_num(ctx->chain);
  if ((long)local_44 != sVar2 - 1) {
    local_44 = local_44 + 1;
  }
  pXVar3 = (X509 *)sk_X509_value(ctx->chain,(long)local_44);
  iVar1 = X509_check_akid(pXVar3,(AUTHORITY_KEYID *)crl->akid);
  if (iVar1 == 0) {
    *pcrl_score = *pcrl_score | 0x1c;
    *pissuer = (X509 *)pXVar3;
  }
  else {
    do {
      local_44 = local_44 + 1;
      sVar2 = sk_X509_num(ctx->chain);
      if ((int)sVar2 <= local_44) {
        return 0;
      }
      pXVar3 = (X509 *)sk_X509_value(ctx->chain,(long)local_44);
      a = X509_get_subject_name(pXVar3);
      iVar1 = X509_NAME_cmp(a,(X509_NAME *)b);
    } while ((iVar1 != 0) ||
            (iVar1 = X509_check_akid(pXVar3,(AUTHORITY_KEYID *)crl->akid), iVar1 != 0));
    *pcrl_score = *pcrl_score | 0xc;
    *pissuer = (X509 *)pXVar3;
  }
  return 1;
}

Assistant:

static int crl_akid_check(X509_STORE_CTX *ctx, X509_CRL *crl, X509 **pissuer,
                          int *pcrl_score) {
  X509 *crl_issuer = NULL;
  X509_NAME *cnm = X509_CRL_get_issuer(crl);
  int cidx = ctx->error_depth;

  if ((size_t)cidx != sk_X509_num(ctx->chain) - 1) {
    cidx++;
  }

  crl_issuer = sk_X509_value(ctx->chain, cidx);

  if (X509_check_akid(crl_issuer, crl->akid) == X509_V_OK) {
    *pcrl_score |= CRL_SCORE_AKID | CRL_SCORE_ISSUER_CERT;
    *pissuer = crl_issuer;
    return 1;
  }

  for (cidx++; cidx < (int)sk_X509_num(ctx->chain); cidx++) {
    crl_issuer = sk_X509_value(ctx->chain, cidx);
    if (X509_NAME_cmp(X509_get_subject_name(crl_issuer), cnm)) {
      continue;
    }
    if (X509_check_akid(crl_issuer, crl->akid) == X509_V_OK) {
      *pcrl_score |= CRL_SCORE_AKID | CRL_SCORE_SAME_PATH;
      *pissuer = crl_issuer;
      return 1;
    }
  }

  return 0;
}